

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void plug_proxy_receive(Plug *p,int urgent,char *data,size_t len)

{
  ProxySocket *ps;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *p_local;
  
  if (p[-0xb].vt == (PlugVtable *)0x0) {
    plug_receive((Plug *)p[-0x20].vt,urgent,data,len);
  }
  else {
    bufchain_add((bufchain *)(p + -0x11),data,len);
    proxy_negotiate((ProxySocket *)(p + -0x22));
  }
  return;
}

Assistant:

static void plug_proxy_receive(
    Plug *p, int urgent, const char *data, size_t len)
{
    ProxySocket *ps = container_of(p, ProxySocket, plugimpl);

    if (ps->pn) {
        /* we will lose the urgentness of this data, but since most,
         * if not all, of this data will be consumed by the negotiation
         * process, hopefully it won't affect the protocol above us
         */
        bufchain_add(&ps->pending_input_data, data, len);
        proxy_negotiate(ps);
    } else {
        plug_receive(ps->plug, urgent, data, len);
    }
}